

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O0

TermPartialOrdering *
Kernel::TermPartialOrdering::set(TermPartialOrdering *tpo,TermOrderingConstraint con)

{
  TermOrderingConstraint con_00;
  bool bVar1;
  int iVar2;
  void *pvVar3;
  TermPartialOrdering *res;
  TermPartialOrdering **ptr;
  TermPartialOrdering *in_stack_ffffffffffffff68;
  TermPartialOrdering *in_stack_ffffffffffffff70;
  TermList *in_stack_ffffffffffffff78;
  TermList *in_stack_ffffffffffffff80;
  TermPartialOrdering **in_stack_ffffffffffffff88;
  TermPartialOrdering ***pval;
  tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  *in_stack_ffffffffffffff98;
  DHMap<std::tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>,_const_Kernel::TermPartialOrdering_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffa0;
  undefined8 uVar4;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 *local_20;
  
  pval = (TermPartialOrdering ***)&stack0x00000008;
  if ((set(Kernel::TermPartialOrdering_const*,Kernel::TermOrderingConstraint)::cache == '\0') &&
     (iVar2 = __cxa_guard_acquire(&set(Kernel::TermPartialOrdering_const*,Kernel::TermOrderingConstraint)
                                   ::cache), iVar2 != 0)) {
    Lib::
    DHMap<std::tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>,_const_Kernel::TermPartialOrdering_*,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::DHMap(&set::cache);
    __cxa_atexit(Lib::
                 DHMap<std::tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>,_const_Kernel::TermPartialOrdering_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::~DHMap,&set::cache,&__dso_handle);
    __cxa_guard_release(&set(Kernel::TermPartialOrdering_const*,Kernel::TermOrderingConstraint)::
                         cache);
  }
  std::
  make_tuple<Kernel::TermPartialOrdering_const*&,Kernel::TermList&,Kernel::TermList&,Kernel::Ordering::Result&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (Result *)in_stack_ffffffffffffff70);
  uVar4 = 0;
  bVar1 = Lib::
          DHMap<std::tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>,_const_Kernel::TermPartialOrdering_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::getValuePtr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,pval,
                        in_stack_ffffffffffffff88);
  if (bVar1) {
    pvVar3 = ::operator_new(0x30);
    TermPartialOrdering(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    con_00.rhs._content = uVar4;
    con_00.lhs._content = (uint64_t)pvVar3;
    con_00._16_8_ = in_stack_ffffffffffffffc0;
    bVar1 = set((TermPartialOrdering *)*pval,con_00);
    if (bVar1) {
      *local_20 = pvVar3;
    }
    else {
      if (pvVar3 != (void *)0x0) {
        ~TermPartialOrdering((TermPartialOrdering *)0x99fc9f);
        ::operator_delete(pvVar3,0x30);
      }
      *local_20 = 0;
    }
  }
  return (TermPartialOrdering *)*local_20;
}

Assistant:

const TermPartialOrdering* TermPartialOrdering::set(const TermPartialOrdering* tpo, TermOrderingConstraint con)
{
  static DHMap<std::tuple<const TermPartialOrdering*, TermList, TermList, Result>, const TermPartialOrdering*> cache;
  const TermPartialOrdering** ptr;
  if (cache.getValuePtr(make_tuple(tpo, con.lhs, con.rhs, con.rel), ptr, nullptr)) {
    auto res = new TermPartialOrdering(*tpo);
    if (!res->set(con)) {
      delete res;
      *ptr = nullptr;
    } else {
      *ptr = res;
    }
  }
  return *ptr;
}